

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DStream * ZSTD_initStaticDStream(void *workspace,size_t workspaceSize)

{
  ZSTD_DCtx *pZVar1;
  size_t workspaceSize_local;
  void *workspace_local;
  
  pZVar1 = ZSTD_initStaticDCtx(workspace,workspaceSize);
  return pZVar1;
}

Assistant:

ZSTD_DStream* ZSTD_initStaticDStream(void *workspace, size_t workspaceSize)
{
    return ZSTD_initStaticDCtx(workspace, workspaceSize);
}